

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyfiledialogs.c
# Opt level: O2

int detectPresence(char *aExecutable)

{
  int iVar1;
  size_t sVar2;
  FILE *__stream;
  char *pcVar3;
  uint uVar4;
  char local_818 [6];
  undefined8 auStack_812 [127];
  char lBuff [1024];
  
  uVar4 = 0;
  memset(local_818,0,0x400);
  builtin_strncpy(local_818,"which ",6);
  strcat(local_818,aExecutable);
  sVar2 = strlen(local_818);
  builtin_strncpy(local_818 + sVar2," 2>/dev/",8);
  *(undefined8 *)((long)auStack_812 + sVar2) = 0x206c6c756e2f76;
  __stream = popen(local_818,"r");
  pcVar3 = fgets(lBuff,0x400,__stream);
  if (pcVar3 != (char *)0x0) {
    pcVar3 = strchr(lBuff,0x3a);
    if (pcVar3 == (char *)0x0) {
      iVar1 = bcmp(lBuff,"no ",3);
      if (iVar1 != 0) {
        pclose(__stream);
        uVar4 = 1;
        goto LAB_001181c7;
      }
    }
  }
  pclose(__stream);
LAB_001181c7:
  if (tinyfd_verbose != 0) {
    printf("detectPresence %s %d\n",aExecutable,(ulong)uVar4);
  }
  return uVar4;
}

Assistant:

static int detectPresence( char const * const aExecutable )
{
        char lBuff [MAX_PATH_OR_CMD] ;
        char lTestedString [MAX_PATH_OR_CMD] = "which " ;
        FILE * lIn ;

    strcat( lTestedString , aExecutable ) ;
        strcat( lTestedString, " 2>/dev/null ");
    lIn = popen( lTestedString , "r" ) ;
    if ( ( fgets( lBuff , sizeof( lBuff ) , lIn ) != NULL )
                && ( ! strchr( lBuff , ':' ) )
                && ( strncmp(lBuff, "no ", 3) ) )
    {   /* present */
        pclose( lIn ) ;
        if (tinyfd_verbose) printf("detectPresence %s %d\n", aExecutable, 1);
        return 1 ;
    }
    else
    {
        pclose( lIn ) ;
        if (tinyfd_verbose) printf("detectPresence %s %d\n", aExecutable, 0);
        return 0 ;
    }
}